

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::CompilerGLSL::emit_sampled_image_op
          (CompilerGLSL *this,uint32_t result_type,uint32_t result_id,uint32_t image_id,
          uint32_t samp_id)

{
  SPIRType *pSVar1;
  uint local_54;
  string local_50;
  
  local_54 = result_id;
  if (((this->options).vulkan_semantics == true) &&
     ((this->super_Compiler).combined_image_samplers.
      super_VectorView<diligent_spirv_cross::CombinedImageSampler>.buffer_size == 0)) {
    pSVar1 = Variant::get<diligent_spirv_cross::SPIRType>
                       ((this->super_Compiler).ir.ids.
                        super_VectorView<diligent_spirv_cross::Variant>.ptr + result_type);
    (*(this->super_Compiler)._vptr_Compiler[0x13])(&local_50,this,pSVar1,(ulong)local_54);
    emit_binary_func_op(this,result_type,result_id,image_id,samp_id,local_50._M_dataplus._M_p);
  }
  else {
    to_combined_image_sampler_abi_cxx11_(&local_50,this,(VariableID)image_id,(VariableID)samp_id);
    emit_op(this,result_type,result_id,&local_50,true,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_M_erase(&(this->super_Compiler).forwarded_temporaries._M_h,&local_54);
  return;
}

Assistant:

void CompilerGLSL::emit_sampled_image_op(uint32_t result_type, uint32_t result_id, uint32_t image_id, uint32_t samp_id)
{
	if (options.vulkan_semantics && combined_image_samplers.empty())
	{
		emit_binary_func_op(result_type, result_id, image_id, samp_id,
		                    type_to_glsl(get<SPIRType>(result_type), result_id).c_str());
	}
	else
	{
		// Make sure to suppress usage tracking. It is illegal to create temporaries of opaque types.
		emit_op(result_type, result_id, to_combined_image_sampler(image_id, samp_id), true, true);
	}

	// Make sure to suppress usage tracking and any expression invalidation.
	// It is illegal to create temporaries of opaque types.
	forwarded_temporaries.erase(result_id);
}